

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_862632::X509Test_TestFromBufferReused_Test::TestBody
          (X509Test_TestFromBufferReused_Test *this)

{
  uint8_t *puVar1;
  long lVar2;
  bool bVar3;
  uint8_t *puVar4;
  size_t sVar5;
  uintptr_t b_u;
  pointer *__ptr;
  UniquePtr<uint8_t> *this_00;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *puVar6;
  char *pcVar7;
  char *in_R9;
  uintptr_t a_u;
  AssertionResult gtest_ar_;
  UniquePtr<X509> root;
  AssertHelper local_a0;
  AssertionResult gtest_ar;
  uint8_t *i2d;
  size_t data2_len;
  UniquePtr<CRYPTO_BUFFER> buf;
  UniquePtr<uint8_t> i2d_storage;
  UniquePtr<uint8_t> data2;
  X509 *raw;
  uint8_t *inp;
  int i2d_len;
  AssertHelper local_38;
  UniquePtr<uint8_t> data;
  size_t data_len;
  X509 *ret;
  
  data._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)
       (__uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>)0x0;
  bVar3 = PEMToDER(&data,&data_len,
                   "\n-----BEGIN CERTIFICATE-----\nMIICVTCCAb6gAwIBAgIIAj5CwoHlWuYwDQYJKoZIhvcNAQELBQAwLjEaMBgGA1UE\nChMRQm9yaW5nU1NMIFRFU1RJTkcxEDAOBgNVBAMTB1Jvb3QgQ0EwIBcNMTUwMTAx\nMDAwMDAwWhgPMjEwMDAxMDEwMDAwMDBaMC4xGjAYBgNVBAoTEUJvcmluZ1NTTCBU\nRVNUSU5HMRAwDgYDVQQDEwdSb290IENBMIGfMA0GCSqGSIb3DQEBAQUAA4GNADCB\niQKBgQDpDn8RDOZa5oaDcPZRBy4CeBH1siSSOO4mYgLHlPE+oXdqwI/VImi2XeJM\n2uCFETXCknJJjYG0iJdrt/yyRFvZTQZw+QzGj+mz36NqhGxDWb6dstB2m8PX+plZ\nw7jl81MDvUnWs8yiQ/6twgu5AbhWKZQDJKcNKCEpqa6UW0r5nwIDAQABo3oweDAO\nBgNVHQ8BAf8EBAMCAgQwHQYDVR0lBBYwFAYIKwYBBQUHAwEGCCsGAQUFBwMCMA8G\nA1UdEwEB/wQFMAMBAf8wGQYDVR0OBBIEEEA31wH7QC+4HH5UBCeMWQEwGwYDVR0j\nBBQwEoAQQDfXAftAL7gcflQEJ4xZATANBgkqhkiG9w0BAQsFAAOBgQDXylEK77Za\nkKeY6ZerrScWyZhrjIGtHFu09qVpdJEzrk87k2G7iHHR9CAvSofCgEExKtWNS9dN\n+9WiZp/U48iHLk7qaYXdEuO07No4BYtXn+lkOykE+FUxmA4wvOF1cTd2tdj3MzX2\nkfGIBAYhzGZWhY3JbhIfTEfY1PNM1pWChQ==\n-----END CERTIFICATE-----\n"
                  );
  gtest_ar_.success_ = bVar3;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&buf);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,
               (AssertionResult *)"PEMToDER(&data, &data_len, kRootCAPEM)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&root,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
               ,0xa5b,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&root,(Message *)&buf);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&root);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if ((__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>)
        buf._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>)0x0) {
      (**(code **)(*(long *)buf._M_t.
                            super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    goto LAB_00353f07;
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  buf._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<crypto_buffer_st,_bssl::internal::Deleter,_true,_true>)
       CRYPTO_BUFFER_new((uint8_t *)
                         data._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>.
                         _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,data_len,
                         (CRYPTO_BUFFER_POOL *)0x0);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       (tuple<crypto_buffer_st_*,_bssl::internal::Deleter>)
       buf._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl !=
       (_Head_base<0UL,_crypto_buffer_st_*,_false>)0x0;
  if ((tuple<crypto_buffer_st_*,_bssl::internal::Deleter>)
      buf._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl ==
      (_Head_base<0UL,_crypto_buffer_st_*,_false>)0x0) {
    testing::Message::Message((Message *)&root);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)0x4d9bb1,"false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&data2_len,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
               ,0xa5f,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&data2_len,(Message *)&root);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&data2_len);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if ((__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
        root._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_x509_st_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0) {
      (**(code **)(*(long *)root._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_x509_st_*,_false>._M_head_impl + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    root._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_x509_st_*,_false>._M_head_impl =
         (__uniq_ptr_data<x509_st,_bssl::internal::Deleter,_true,_true>)
         X509_parse_from_buffer
                   ((CRYPTO_BUFFER *)
                    buf._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
                    super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ =
         (tuple<x509_st_*,_bssl::internal::Deleter>)
         root._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_x509_st_*,_false>._M_head_impl !=
         (_Head_base<0UL,_x509_st_*,_false>)0x0;
    if ((tuple<x509_st_*,_bssl::internal::Deleter>)
        root._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_x509_st_*,_false>._M_head_impl ==
        (_Head_base<0UL,_x509_st_*,_false>)0x0) {
      testing::Message::Message((Message *)&data2_len);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)0x520523,"false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&data2,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0xa62,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
      testing::internal::AssertHelper::operator=((AssertHelper *)&data2,(Message *)&data2_len);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&data2);
      std::__cxx11::string::~string((string *)&gtest_ar);
      if (data2_len != 0) {
        (**(code **)(*(long *)data2_len + 8))();
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      data2._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)
           (__uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>)0x0;
      bVar3 = PEMToDER(&data2,&data2_len,
                       "\n-----BEGIN CERTIFICATE-----\nMIICXjCCAcegAwIBAgIIWjO48ufpunYwDQYJKoZIhvcNAQELBQAwNjEaMBgGA1UE\nChMRQm9yaW5nU1NMIFRFU1RJTkcxGDAWBgNVBAMTD0ludGVybWVkaWF0ZSBDQTAg\nFw0xNTAxMDEwMDAwMDBaGA8yMTAwMDEwMTAwMDAwMFowMjEaMBgGA1UEChMRQm9y\naW5nU1NMIFRFU1RJTkcxFDASBgNVBAMTC2V4YW1wbGUuY29tMIGfMA0GCSqGSIb3\nDQEBAQUAA4GNADCBiQKBgQDD0U0ZYgqShJ7oOjsyNKyVXEHqeafmk/bAoPqY/h1c\noPw2E8KmeqiUSoTPjG5IXSblOxcqpbAXgnjPzo8DI3GNMhAf8SYNYsoH7gc7Uy7j\n5x8bUrisGnuTHqkqH6d4/e7ETJ7i3CpR8bvK16DggEvQTudLipz8FBHtYhFakfdh\nTwIDAQABo3cwdTAOBgNVHQ8BAf8EBAMCBaAwHQYDVR0lBBYwFAYIKwYBBQUHAwEG\nCCsGAQUFBwMCMAwGA1UdEwEB/wQCMAAwGQYDVR0OBBIEEKN5pvbur7mlXjeMEYA0\n4nUwGwYDVR0jBBQwEoAQjBpoqLV2211Xex+NFLIGozANBgkqhkiG9w0BAQsFAAOB\ngQBj/p+JChp//LnXWC1k121LM/ii7hFzQzMrt70bny406SGz9jAjaPOX4S3gt38y\nrhjpPukBlSzgQXFg66y6q5qp1nQTD1Cw6NkKBe9WuBlY3iYfmsf7WT8nhlT1CttU\nxNCwyMX9mtdXdQicOfNjIGUCD5OLV5PgHFPRKiHHioBAhg==\n-----END CERTIFICATE-----\n"
                      );
      puVar6 = &gtest_ar_.message_;
      gtest_ar_.success_ = bVar3;
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      if (bVar3) {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(puVar6);
        puVar1 = *(uint8_t **)
                  (*(long *)root._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_x509_st_*,_false>._M_head_impl + 0x50);
        lVar2 = *(long *)(*(long *)root._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                                   ._M_t.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_x509_st_*,_false>._M_head_impl + 0x58);
        puVar4 = CRYPTO_BUFFER_data((CRYPTO_BUFFER *)
                                    buf._M_t.
                                    super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>
                                    .super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl);
        sVar5 = CRYPTO_BUFFER_len((CRYPTO_BUFFER *)
                                  buf._M_t.
                                  super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>.
                                  _M_t.
                                  super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>
                                  .super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl);
        gtest_ar_.success_ = puVar1 < puVar4 + sVar5 && puVar4 < puVar1 + lVar2;
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        if (puVar1 >= puVar4 + sVar5 || puVar4 >= puVar1 + lVar2) {
          testing::Message::Message((Message *)&raw);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar,(internal *)&gtest_ar_,
                     (AssertionResult *)
                     "buffers_alias(root->cert_info->enc.enc, root->cert_info->enc.len, CRYPTO_BUFFER_data(buf.get()), CRYPTO_BUFFER_len(buf.get()))"
                     ,"false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&inp,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0xa69,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
          testing::internal::AssertHelper::operator=((AssertHelper *)&inp,(Message *)&raw);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&inp);
          std::__cxx11::string::~string((string *)&gtest_ar);
          if (raw != (X509 *)0x0) {
            (*(code *)raw->cert_info->serialNumber)();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        raw = (X509 *)root;
        root._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_x509_st_*,_false>._M_head_impl =
             (__uniq_ptr_data<x509_st,_bssl::internal::Deleter,_true,_true>)
             (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0;
        inp = (uint8_t *)
              data2._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
        ret = (X509 *)d2i_X509((X509 **)&raw,&inp,data2_len);
        std::__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>::reset
                  ((__uniq_ptr_impl<x509_st,_bssl::internal::Deleter> *)&root,raw);
        gtest_ar_._0_8_ =
             root._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
        testing::internal::CmpHelperEQ<x509_st*,x509_st*>
                  ((internal *)&gtest_ar,"root.get()","ret",(x509_st **)&gtest_ar_,&ret);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar_);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar7 = "";
          }
          else {
            pcVar7 = *(char **)gtest_ar.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&i2d,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0xa75,pcVar7);
          testing::internal::AssertHelper::operator=((AssertHelper *)&i2d,(Message *)&gtest_ar_);
LAB_00353ec3:
          this_00 = (UniquePtr<uint8_t> *)&i2d;
LAB_00353ecd:
          puVar6 = &gtest_ar.message_;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
          if (gtest_ar_._0_8_ != 0) {
            (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
          }
          goto LAB_00353ee4;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar.message_);
        testing::internal::EqHelper::Compare<crypto_buffer_st>
                  ((EqHelper *)&gtest_ar,"nullptr","root->cert_info->enc.buf",(nullptr_t)0x0,
                   *(crypto_buffer_st **)
                    (*(long *)root._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t
                              .super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_x509_st_*,_false>._M_head_impl + 0x60));
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar_);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar7 = "";
          }
          else {
            pcVar7 = *(char **)gtest_ar.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&i2d,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0xa76,pcVar7);
          testing::internal::AssertHelper::operator=((AssertHelper *)&i2d,(Message *)&gtest_ar_);
          goto LAB_00353ec3;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar.message_);
        puVar1 = *(uint8_t **)
                  (*(long *)root._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_x509_st_*,_false>._M_head_impl + 0x50);
        lVar2 = *(long *)(*(long *)root._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                                   ._M_t.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_x509_st_*,_false>._M_head_impl + 0x58);
        puVar4 = CRYPTO_BUFFER_data((CRYPTO_BUFFER *)
                                    buf._M_t.
                                    super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>
                                    .super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl);
        sVar5 = CRYPTO_BUFFER_len((CRYPTO_BUFFER *)
                                  buf._M_t.
                                  super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>.
                                  _M_t.
                                  super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>
                                  .super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl);
        gtest_ar_.success_ = puVar4 + sVar5 <= puVar1 || puVar1 + lVar2 <= puVar4;
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        if (puVar4 + sVar5 > puVar1 && puVar1 + lVar2 > puVar4) {
          testing::Message::Message((Message *)&i2d);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar,(internal *)&gtest_ar_,
                     (AssertionResult *)
                     "buffers_alias(root->cert_info->enc.enc, root->cert_info->enc.len, CRYPTO_BUFFER_data(buf.get()), CRYPTO_BUFFER_len(buf.get()))"
                     ,"true","false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&i2d_storage,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0xa79,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
          testing::internal::AssertHelper::operator=((AssertHelper *)&i2d_storage,(Message *)&i2d);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i2d_storage);
          std::__cxx11::string::~string((string *)&gtest_ar);
          if (i2d != (uint8_t *)0x0) {
            (**(code **)(*(long *)i2d + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        std::__uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>::reset
                  ((__uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter> *)&data2,(pointer)0x0);
        i2d = (uint8_t *)0x0;
        i2d_len = i2d_X509((X509 *)root._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                                   ._M_t.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,&i2d);
        gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
        testing::internal::CmpHelperGE<int,int>
                  ((internal *)&gtest_ar,"i2d_len","0",&i2d_len,(int *)&gtest_ar_);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar_);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar7 = "";
          }
          else {
            pcVar7 = *(char **)gtest_ar.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&i2d_storage,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0xa81,pcVar7);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&i2d_storage,(Message *)&gtest_ar_);
          this_00 = &i2d_storage;
          goto LAB_00353ecd;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar.message_);
        i2d_storage._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
             (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)
             (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)i2d;
        bVar3 = PEMToDER(&data2,&data2_len,
                         "\n-----BEGIN CERTIFICATE-----\nMIICXjCCAcegAwIBAgIIWjO48ufpunYwDQYJKoZIhvcNAQELBQAwNjEaMBgGA1UE\nChMRQm9yaW5nU1NMIFRFU1RJTkcxGDAWBgNVBAMTD0ludGVybWVkaWF0ZSBDQTAg\nFw0xNTAxMDEwMDAwMDBaGA8yMTAwMDEwMTAwMDAwMFowMjEaMBgGA1UEChMRQm9y\naW5nU1NMIFRFU1RJTkcxFDASBgNVBAMTC2V4YW1wbGUuY29tMIGfMA0GCSqGSIb3\nDQEBAQUAA4GNADCBiQKBgQDD0U0ZYgqShJ7oOjsyNKyVXEHqeafmk/bAoPqY/h1c\noPw2E8KmeqiUSoTPjG5IXSblOxcqpbAXgnjPzo8DI3GNMhAf8SYNYsoH7gc7Uy7j\n5x8bUrisGnuTHqkqH6d4/e7ETJ7i3CpR8bvK16DggEvQTudLipz8FBHtYhFakfdh\nTwIDAQABo3cwdTAOBgNVHQ8BAf8EBAMCBaAwHQYDVR0lBBYwFAYIKwYBBQUHAwEG\nCCsGAQUFBwMCMAwGA1UdEwEB/wQCMAAwGQYDVR0OBBIEEKN5pvbur7mlXjeMEYA0\n4nUwGwYDVR0jBBQwEoAQjBpoqLV2211Xex+NFLIGozANBgkqhkiG9w0BAQsFAAOB\ngQBj/p+JChp//LnXWC1k121LM/ii7hFzQzMrt70bny406SGz9jAjaPOX4S3gt38y\nrhjpPukBlSzgQXFg66y6q5qp1nQTD1Cw6NkKBe9WuBlY3iYfmsf7WT8nhlT1CttU\nxNCwyMX9mtdXdQicOfNjIGUCD5OLV5PgHFPRKiHHioBAhg==\n-----END CERTIFICATE-----\n"
                        );
        puVar6 = &gtest_ar_.message_;
        gtest_ar_.success_ = bVar3;
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        if (bVar3) {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(puVar6);
          gtest_ar_._0_8_ = data2_len;
          testing::internal::CmpHelperEQ<long,int>
                    ((internal *)&gtest_ar,"static_cast<long>(data2_len)","i2d_len",
                     (long *)&gtest_ar_,&i2d_len);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar_);
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl ==
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pcVar7 = "";
            }
            else {
              pcVar7 = *(char **)gtest_ar.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_a0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                       ,0xa86,pcVar7);
            testing::internal::AssertHelper::operator=(&local_a0,(Message *)&gtest_ar_);
          }
          else {
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar.message_);
            gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
            if ((long)i2d_len == 0) {
              local_a0.data_._0_4_ = 0;
            }
            else {
              local_a0.data_._0_4_ =
                   memcmp((void *)data2._M_t.
                                  super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t
                                  .super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,i2d,
                          (long)i2d_len);
            }
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)&gtest_ar,"0","OPENSSL_memcmp(data2.get(), i2d, i2d_len)",
                       (int *)&gtest_ar_,(int *)&local_a0);
            if (gtest_ar.success_ != false) {
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar.message_);
              testing::internal::EqHelper::Compare<crypto_buffer_st>
                        ((EqHelper *)&gtest_ar,"nullptr","root->cert_info->enc.buf",(nullptr_t)0x0,
                         *(crypto_buffer_st **)
                          (*(long *)root._M_t.
                                    super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                                    super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                    super__Head_base<0UL,_x509_st_*,_false>._M_head_impl + 0x60));
              if (gtest_ar.success_ == false) {
                testing::Message::Message((Message *)&gtest_ar_);
                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )gtest_ar.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl ==
                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )0x0) {
                  pcVar7 = "";
                }
                else {
                  pcVar7 = *(char **)gtest_ar.message_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_a0,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                           ,0xa88,pcVar7);
                testing::internal::AssertHelper::operator=(&local_a0,(Message *)&gtest_ar_);
                testing::internal::AssertHelper::~AssertHelper(&local_a0);
                if (gtest_ar_._0_8_ != 0) {
                  (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
                }
              }
              puVar6 = &gtest_ar.message_;
              goto LAB_0035416f;
            }
            testing::Message::Message((Message *)&gtest_ar_);
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl ==
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pcVar7 = "";
            }
            else {
              pcVar7 = *(char **)gtest_ar.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_a0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                       ,0xa87,pcVar7);
            testing::internal::AssertHelper::operator=(&local_a0,(Message *)&gtest_ar_);
          }
          puVar6 = &gtest_ar.message_;
          testing::internal::AssertHelper::~AssertHelper(&local_a0);
          if (gtest_ar_._0_8_ != 0) {
            (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
          }
        }
        else {
          testing::Message::Message((Message *)&local_a0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar,(internal *)&gtest_ar_,
                     (AssertionResult *)"PEMToDER(&data2, &data2_len, kLeafPEM)","false","true",
                     in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_38,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0xa84,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
          testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_a0);
          testing::internal::AssertHelper::~AssertHelper(&local_38);
          std::__cxx11::string::~string((string *)&gtest_ar);
          if ((long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) + 8))();
          }
        }
LAB_0035416f:
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(puVar6);
        std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr(&i2d_storage);
      }
      else {
        testing::Message::Message((Message *)&raw);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)&gtest_ar_,
                   (AssertionResult *)"PEMToDER(&data2, &data2_len, kLeafPEM)","false","true",in_R9)
        ;
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&inp,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                   ,0xa66,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
        testing::internal::AssertHelper::operator=((AssertHelper *)&inp,(Message *)&raw);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&inp);
        std::__cxx11::string::~string((string *)&gtest_ar);
        if (raw != (X509 *)0x0) {
          (*(code *)raw->cert_info->serialNumber)();
        }
LAB_00353ee4:
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(puVar6);
      }
      std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr(&data2);
    }
    std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr(&root);
  }
  std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr(&buf);
LAB_00353f07:
  std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr(&data);
  return;
}

Assistant:

TEST(X509Test, TestFromBufferReused) {
  size_t data_len;
  bssl::UniquePtr<uint8_t> data;
  ASSERT_TRUE(PEMToDER(&data, &data_len, kRootCAPEM));

  bssl::UniquePtr<CRYPTO_BUFFER> buf(
      CRYPTO_BUFFER_new(data.get(), data_len, nullptr));
  ASSERT_TRUE(buf);

  bssl::UniquePtr<X509> root(X509_parse_from_buffer(buf.get()));
  ASSERT_TRUE(root);

  size_t data2_len;
  bssl::UniquePtr<uint8_t> data2;
  ASSERT_TRUE(PEMToDER(&data2, &data2_len, kLeafPEM));
  EXPECT_TRUE(buffers_alias(root->cert_info->enc.enc, root->cert_info->enc.len,
                            CRYPTO_BUFFER_data(buf.get()),
                            CRYPTO_BUFFER_len(buf.get())));

  // Historically, this function tested the interaction betweeen
  // |X509_parse_from_buffer| and object reuse. We no longer support object
  // reuse, so |d2i_X509| will replace |raw| with a new object. However, we
  // retain this test to verify that releasing objects from |d2i_X509| works
  // correctly.
  X509 *raw = root.release();
  const uint8_t *inp = data2.get();
  X509 *ret = d2i_X509(&raw, &inp, data2_len);
  root.reset(raw);

  ASSERT_EQ(root.get(), ret);
  ASSERT_EQ(nullptr, root->cert_info->enc.buf);
  EXPECT_FALSE(buffers_alias(root->cert_info->enc.enc, root->cert_info->enc.len,
                             CRYPTO_BUFFER_data(buf.get()),
                             CRYPTO_BUFFER_len(buf.get())));

  // Free |data2| and ensure that |root| took its own copy. Otherwise the
  // following will trigger a use-after-free.
  data2.reset();

  uint8_t *i2d = nullptr;
  int i2d_len = i2d_X509(root.get(), &i2d);
  ASSERT_GE(i2d_len, 0);
  bssl::UniquePtr<uint8_t> i2d_storage(i2d);

  ASSERT_TRUE(PEMToDER(&data2, &data2_len, kLeafPEM));

  ASSERT_EQ(static_cast<long>(data2_len), i2d_len);
  ASSERT_EQ(0, OPENSSL_memcmp(data2.get(), i2d, i2d_len));
  ASSERT_EQ(nullptr, root->cert_info->enc.buf);
}